

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2max_distance_targets.cc
# Opt level: O2

bool __thiscall
S2MaxDistanceShapeIndexTarget::UpdateMinDistance
          (S2MaxDistanceShapeIndexTarget *this,S2Point *v0,S2Point *v1,S2MaxDistance *min_dist)

{
  Result RVar1;
  EdgeTarget target;
  EdgeTarget local_50;
  
  *(double *)
   &(((this->query_)._M_t.
      super___uniq_ptr_impl<S2FurthestEdgeQuery,_std::default_delete<S2FurthestEdgeQuery>_>._M_t.
      super__Tuple_impl<0UL,_S2FurthestEdgeQuery_*,_std::default_delete<S2FurthestEdgeQuery>_>.
      super__Head_base<0UL,_S2FurthestEdgeQuery_*,_false>._M_head_impl)->options_).super_Options =
       (min_dist->distance_).length2_;
  S2FurthestEdgeQuery::EdgeTarget::EdgeTarget(&local_50,v0,v1);
  RVar1 = S2FurthestEdgeQuery::FindFurthestEdge
                    ((this->query_)._M_t.
                     super___uniq_ptr_impl<S2FurthestEdgeQuery,_std::default_delete<S2FurthestEdgeQuery>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_S2FurthestEdgeQuery_*,_std::default_delete<S2FurthestEdgeQuery>_>
                     .super__Head_base<0UL,_S2FurthestEdgeQuery_*,_false>._M_head_impl,
                     (Target *)&local_50);
  if (-1 < RVar1.shape_id_) {
    (min_dist->distance_).length2_ = RVar1.distance_.length2_.length2_;
  }
  return -1 < RVar1.shape_id_;
}

Assistant:

bool S2MaxDistanceShapeIndexTarget::UpdateMinDistance(
    const S2Point& v0, const S2Point& v1, S2MaxDistance* min_dist) {
  query_->mutable_options()->set_min_distance(S1ChordAngle(*min_dist));
  S2FurthestEdgeQuery::EdgeTarget target(v0, v1);
  S2FurthestEdgeQuery::Result r = query_->FindFurthestEdge(&target);
  if (r.shape_id() < 0) return false;
  *min_dist = S2MaxDistance(r.distance());
  return true;
}